

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gen.hpp
# Opt level: O3

unsigned_long __thiscall rc::Gen<unsigned_long>::operator*(Gen<unsigned_long> *this)

{
  ValueType pGVar1;
  unsigned_long uVar2;
  ValueType *ppGVar3;
  unsigned_long *puVar4;
  _func_Any_unsigned_long_ptr **in_RCX;
  _Head_base<0UL,_rc::detail::Any::IAnyImpl_*,_false> local_a0;
  undefined1 local_98 [48];
  Gen<rc::detail::Any> local_68;
  Gen<unsigned_long> local_40;
  
  ppGVar3 = rc::detail::ImplicitParam<rc::gen::detail::param::CurrentHandler>::value();
  pGVar1 = *ppGVar3;
  Gen(&local_40,this);
  local_98._0_8_ = rc::detail::Any::of<unsigned_long>;
  rc::gen::map<unsigned_long,rc::detail::Any(*)(unsigned_long&&)>
            ((Gen<rc::detail::Any> *)(local_98 + 8),(gen *)&local_40,(Gen<unsigned_long> *)local_98,
             in_RCX);
  Gen<rc::detail::Any>::as(&local_68,(Gen<rc::detail::Any> *)(local_98 + 8),&this->m_name);
  (**pGVar1->_vptr_GenerationHandler)(&local_a0,pGVar1,&local_68);
  puVar4 = rc::detail::Any::get<unsigned_long>((Any *)&local_a0);
  uVar2 = *puVar4;
  if (local_a0._M_head_impl != (IAnyImpl *)0x0) {
    (*(local_a0._M_head_impl)->_vptr_IAnyImpl[5])();
  }
  local_a0._M_head_impl = (IAnyImpl *)0x0;
  Gen<rc::detail::Any>::~Gen(&local_68);
  Gen<rc::detail::Any>::~Gen((Gen<rc::detail::Any> *)(local_98 + 8));
  ~Gen(&local_40);
  return uVar2;
}

Assistant:

T Gen<T>::operator*() const {
  using namespace detail;
  using rc::gen::detail::param::CurrentHandler;
  const auto handler = ImplicitParam<CurrentHandler>::value();
  return std::move(handler->onGenerate(gen::map(*this, &Any::of<T>).as(m_name))
                       .template get<T>());
}